

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

int context_add_value(context_t *ctx,yajl_val v)

{
  yajl_val value;
  context_t *in_RSI;
  yajl_val in_RDI;
  char *key;
  yajl_val in_stack_ffffffffffffffd8;
  yajl_val in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(long *)in_RDI == 0) {
    (in_RDI->u).string = (char *)in_RSI;
    iVar1 = 0;
  }
  else if ((*(long *)(*(long *)in_RDI + 8) == 0) || (**(int **)(*(long *)in_RDI + 8) != 3)) {
    if ((*(long *)(*(long *)in_RDI + 8) == 0) || (**(int **)(*(long *)in_RDI + 8) != 4)) {
      if ((in_RDI->u).object.values != (yajl_val *)0x0) {
        snprintf((char *)(in_RDI->u).object.values,(in_RDI->u).object.len,
                 "context_add_value: Cannot add value to a value of type %#04x (not a composite type)"
                 ,(ulong)**(uint **)(*(long *)in_RDI + 8));
      }
      iVar1 = 0x16;
    }
    else {
      iVar1 = array_add_value(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
  }
  else if (**(long **)in_RDI == 0) {
    if ((in_RSI == (context_t *)0x0) || (*(int *)&in_RSI->stack != 1)) {
      if ((in_RDI->u).object.values != (yajl_val *)0x0) {
        snprintf((char *)(in_RDI->u).object.values,(in_RDI->u).object.len,
                 "context_add_value: Object key is not a string (%#04x)",
                 (ulong)*(uint *)&in_RSI->stack);
      }
      iVar1 = 0x16;
    }
    else {
      **(undefined8 **)in_RDI = in_RSI->root;
      in_RSI->root = (yajl_val)0x0;
      free(in_RSI);
      iVar1 = 0;
    }
  }
  else {
    value = (yajl_val)**(undefined8 **)in_RDI;
    **(undefined8 **)in_RDI = 0;
    iVar1 = object_add_keyval((context_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              (char *)in_RSI,value);
  }
  return iVar1;
}

Assistant:

static int context_add_value (context_t *ctx, yajl_val v)
{
    /* We're checking for NULL values in all the calling functions. */
    assert (ctx != NULL);
    assert (v != NULL);

    /*
     * There are three valid states in which this function may be called:
     *   - There is no value on the stack => This is the only value. This is the
     *     last step done when parsing a document. We assign the value to the
     *     "root" member and return.
     *   - The value on the stack is an object. In this case store the key on the
     *     stack or, if the key has already been read, add key and value to the
     *     object.
     *   - The value on the stack is an array. In this case simply add the value
     *     and return.
     */
    if (ctx->stack == NULL)
    {
        assert (ctx->root == NULL);
        ctx->root = v;
        return (0);
    }
    else if (YAJL_IS_OBJECT (ctx->stack->value))
    {
        if (ctx->stack->key == NULL)
        {
            if (!YAJL_IS_STRING (v))
                RETURN_ERROR (ctx, EINVAL, "context_add_value: "
                              "Object key is not a string (%#04x)",
                              v->type);

            ctx->stack->key = v->u.string;
            v->u.string = NULL;
            free(v);
            return (0);
        }
        else /* if (ctx->key != NULL) */
        {
            char * key;

            key = ctx->stack->key;
            ctx->stack->key = NULL;
            return (object_add_keyval (ctx, ctx->stack->value, key, v));
        }
    }
    else if (YAJL_IS_ARRAY (ctx->stack->value))
    {
        return (array_add_value (ctx, ctx->stack->value, v));
    }
    else
    {
        RETURN_ERROR (ctx, EINVAL, "context_add_value: Cannot add value to "
                      "a value of type %#04x (not a composite type)",
                      ctx->stack->value->type);
    }
}